

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O2

char * tf::to_string(TaskType type)

{
  if (type < UNDEFINED) {
    return &DAT_0012671c + *(int *)(&DAT_0012671c + (ulong)type * 4);
  }
  return "undefined";
}

Assistant:

inline const char* to_string(TaskType type) {

  const char* val;

  switch(type) {
    case TaskType::PLACEHOLDER:      val = "placeholder";     break;
    case TaskType::STATIC:           val = "static";          break;
    case TaskType::RUNTIME:          val = "runtime";         break;
    case TaskType::SUBFLOW:          val = "subflow";         break;
    case TaskType::CONDITION:        val = "condition";       break;
    case TaskType::MODULE:           val = "module";          break;
    case TaskType::ASYNC:            val = "async";           break;
    default:                         val = "undefined";       break;
  }

  return val;
}